

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::WriteUIntSize(IMkvWriter *writer,uint64 value,int32 size)

{
  uint64 max;
  int64 bit_1;
  uint64 bit;
  ulong uStack_20;
  int32 size_local;
  uint64 value_local;
  IMkvWriter *writer_local;
  
  if (((writer == (IMkvWriter *)0x0) || (size < 0)) || (8 < size)) {
    writer_local._4_4_ = -1;
  }
  else {
    if (size < 1) {
      bit._4_4_ = 1;
      while (uStack_20 = 1L << ((char)bit._4_4_ * '\a' & 0x3fU), uStack_20 - 2 < value) {
        bit._4_4_ = bit._4_4_ + 1;
      }
      if (8 < bit._4_4_) {
        return 0;
      }
    }
    else {
      uStack_20 = 1L << ((char)size * '\a' & 0x3fU);
      bit._4_4_ = size;
      if (uStack_20 - 2 < value) {
        return -1;
      }
    }
    uStack_20 = uStack_20 | value;
    writer_local._4_4_ = SerializeInt(writer,uStack_20,bit._4_4_);
  }
  return writer_local._4_4_;
}

Assistant:

int32 WriteUIntSize(IMkvWriter* writer, uint64 value, int32 size) {
  if (!writer || size < 0 || size > 8)
    return -1;

  if (size > 0) {
    const uint64 bit = 1LL << (size * 7);

    if (value > (bit - 2))
      return -1;

    value |= bit;
  } else {
    size = 1;
    int64 bit;

    for (;;) {
      bit = 1LL << (size * 7);
      const uint64 max = bit - 2;

      if (value <= max)
        break;

      ++size;
    }

    if (size > 8)
      return false;

    value |= bit;
  }

  return SerializeInt(writer, value, size);
}